

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Store::Collect(Store *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  uint uVar1;
  pointer ppOVar2;
  pointer ppOVar3;
  ulong *puVar4;
  Object *pOVar5;
  pointer pRVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  pointer puVar9;
  pointer pRVar10;
  ulong *__s;
  ulong uVar11;
  size_type __new_size;
  
  if ((this->gc_context_).call_depth != 0) {
    __assert_fail("gc_context_.call_depth == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                  ,0xfe,"void wabt::interp::Store::Collect()");
  }
  ppOVar2 = (this->objects_).list_.
            super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar3 = (this->objects_).list_.
            super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)ppOVar3 - (long)ppOVar2 >> 3;
  this_00 = &(this->gc_context_).marks;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,__new_size,false);
  __s = (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar4 = (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (__s != puVar4) {
    memset(__s,0,(long)puVar4 - (long)__s);
    __s = puVar4;
  }
  if (uVar1 != 0) {
    *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  pRVar6 = (this->roots_).list_.
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar10 = (this->roots_).list_.
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pRVar10 != pRVar6) {
    uVar11 = 0;
    do {
      if (-1 < (long)pRVar6[uVar11].index) {
        Mark(this,(Ref)pRVar6[uVar11].index);
        pRVar6 = (this->roots_).list_.
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pRVar10 = (this->roots_).list_.
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)pRVar10 - (long)pRVar6 >> 3));
  }
  for (p_Var7 = (this->threads_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->threads_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    Thread::Mark(*(Thread **)(p_Var7 + 1));
  }
  puVar9 = (this->gc_context_).untraced_objects.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->gc_context_).untraced_objects.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != puVar9) {
    do {
      uVar11 = puVar9[-1];
      uVar8 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar8 = uVar11;
      }
      if (((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar8 >> 6) +
            (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar11 & 0x3f) & 1) == 0) {
        __assert_fail("gc_context_.marks[index]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                      ,0x113,"void wabt::interp::Store::Collect()");
      }
      if ((this->gc_context_).call_depth != 0) {
        __assert_fail("gc_context_.call_depth == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                      ,0x114,"void wabt::interp::Store::Collect()");
      }
      (this->gc_context_).untraced_objects.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9 + -1;
      pOVar5 = (this->objects_).list_.
               super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11];
      if (((ulong)pOVar5 & 1) != 0) {
        __assert_fail("IsUsed(index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                      ,0xe5,
                      "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
                     );
      }
      (*pOVar5->_vptr_Object[2])(pOVar5,this);
      puVar9 = (this->gc_context_).untraced_objects.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((this->gc_context_).untraced_objects.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start != puVar9);
  }
  if ((this->gc_context_).call_depth == 0) {
    if (ppOVar3 != ppOVar2) {
      uVar11 = 0;
      do {
        if (((ulong)(this->objects_).list_.
                    super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11] & 1) == 0) {
          uVar8 = uVar11 + 0x3f;
          if (-1 < (long)uVar11) {
            uVar8 = uVar11;
          }
          if (((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar8 >> 6) +
                (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar11 & 0x3f) & 1) == 0) {
            FreeList<wabt::interp::Object_*>::Delete(&this->objects_,uVar11);
          }
        }
        uVar11 = uVar11 + 1;
      } while (__new_size + (__new_size == 0) != uVar11);
    }
    return;
  }
  __assert_fail("gc_context_.call_depth == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                ,0x11a,"void wabt::interp::Store::Collect()");
}

Assistant:

void Store::Collect() {
  size_t object_count = objects_.size();

  assert(gc_context_.call_depth == 0);

  gc_context_.marks.resize(object_count);
  std::fill(gc_context_.marks.begin(), gc_context_.marks.end(), false);

  // First mark all roots.
  for (RootList::Index i = 0; i < roots_.size(); ++i) {
    if (roots_.IsUsed(i)) {
      Mark(roots_.Get(i));
    }
  }

  for (auto thread : threads_) {
    thread->Mark();
  }

  // This vector is often empty since the default maximum
  // recursion is usually enough to mark all objects.
  while (WABT_UNLIKELY(!gc_context_.untraced_objects.empty())) {
    size_t index = gc_context_.untraced_objects.back();

    assert(gc_context_.marks[index]);
    assert(gc_context_.call_depth == 0);

    gc_context_.untraced_objects.pop_back();
    objects_.Get(index)->Mark(*this);
  }

  assert(gc_context_.call_depth == 0);

  // Delete all unmarked objects.
  for (size_t i = 0; i < object_count; ++i) {
    if (objects_.IsUsed(i) && !gc_context_.marks[i]) {
      objects_.Delete(i);
    }
  }
}